

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O2

Am_Wrapper * Am_Compute_MG_Feedback_Object_proc(Am_Object *self)

{
  bool bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Object *prev;
  Am_Wrapper *pAVar4;
  Am_Object feedback;
  Am_Object local_28;
  Am_Object owner;
  Am_Object local_18;
  
  feedback.data = (Am_Object_Data *)0x0;
  Am_Object::Get_Owner(&owner,(Am_Slot_Flags)self);
  pAVar3 = Am_Object::Get(self,0xdb,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
  pAVar3 = Am_Object::Get(&owner,bVar1 ^ 0x1df,0);
  Am_Object::operator=(&feedback,pAVar3);
  bVar2 = Am_Object::Valid(&feedback);
  if (bVar2) {
    Am_Object::Get_Object(&local_28,(Am_Slot_Key)&feedback,0x193);
    bVar2 = Am_Object::operator!=(&local_28,&owner);
    Am_Object::~Am_Object(&local_28);
    if (bVar2) {
      Am_Object::Create(&local_28,(char *)&feedback);
      prev = Am_Object::Set(&local_28,0x69,false,0);
      Am_Object::operator=(&feedback,prev);
      Am_Object::~Am_Object(&local_28);
      pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&owner);
      Am_Object::Set(&feedback,0x193,pAVar4,0);
      pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&feedback);
      Am_Object::Set(&owner,bVar1 ^ 0x1df,pAVar4,0);
      Am_Object::Am_Object(&local_18,&feedback);
      Am_Object::Add_Part(&owner,&local_18,false,0);
      Am_Object::~Am_Object(&local_18);
    }
  }
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&feedback);
  Am_Object::~Am_Object(&owner);
  Am_Object::~Am_Object(&feedback);
  return pAVar4;
}

Assistant:

Am_Define_Object_Formula(Am_Compute_MG_Feedback_Object)
{
  Am_Object feedback;
  Am_Object owner = self.Get_Owner();
  bool as_line = self.Get(Am_AS_LINE);
  feedback =
      owner.Get(as_line ? Am_LINE_FEEDBACK_OBJECT : Am_RECT_FEEDBACK_OBJECT);
  if (feedback.Valid() &&
      feedback.Get_Object(Am_OPERATES_ON, Am_NO_DEPENDENCY) != owner) {
    feedback = feedback.Create().Set(Am_VISIBLE, false);
    feedback.Set(Am_OPERATES_ON, owner);
    owner.Set(as_line ? Am_LINE_FEEDBACK_OBJECT : Am_RECT_FEEDBACK_OBJECT,
              feedback);
    owner.Add_Part(feedback, false);
  }
  return feedback;
}